

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fPrimitiveBoundingBoxTests.cpp
# Opt level: O3

int __thiscall
deqp::gles31::Functional::anon_unknown_1::BlitFboCase::init(BlitFboCase *this,EVP_PKEY_CTX *ctx)

{
  MovePtr<glu::TypedObjectWrapper<(glu::ObjectType)2>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)2>_>_>
  *pMVar1;
  MovePtr<glu::TypedObjectWrapper<(glu::ObjectType)3>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)3>_>_>
  *this_00;
  MovePtr<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_> *this_01;
  pointer *ppBVar2;
  int iVar3;
  Context *this_02;
  RenderContext *renderCtx;
  pointer __a;
  pointer pBVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  uint uVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  ContextType ctxType;
  deUint32 dVar11;
  RenderTarget RVar12;
  deUint32 dVar13;
  deUint32 dVar14;
  deUint32 dVar15;
  deBool dVar16;
  RenderTarget *pRVar17;
  undefined4 extraout_var;
  ObjectWrapper *pOVar18;
  undefined4 extraout_var_00;
  ObjectTraits *pOVar19;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  ShaderProgram *pSVar20;
  undefined4 extraout_var_04;
  pointer extraout_RAX;
  ulong uVar21;
  pointer pBVar22;
  pointer pBVar23;
  NotSupportedError *pNVar24;
  TestError *this_03;
  int i;
  undefined8 in_RCX;
  long lVar25;
  BlitArgs *__args;
  BlitArgs *extraout_RDX;
  BlitArgs *__args_00;
  float fVar26;
  char *pcVar27;
  ulong uVar28;
  char *pcVar29;
  EVP_PKEY_CTX *ctx_00;
  int iVar30;
  int iVar31;
  uint uVar32;
  long lVar33;
  ulong uVar34;
  pointer pBVar35;
  bool bVar36;
  float fVar37;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Db_01;
  undefined4 extraout_XMM0_Db_02;
  undefined4 extraout_XMM0_Db_03;
  undefined4 extraout_XMM0_Db_04;
  undefined4 extraout_XMM0_Db_05;
  undefined4 extraout_XMM0_Db_06;
  undefined1 auVar39 [16];
  undefined1 auVar41 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  float __tmp;
  Random rnd;
  BlitArgs args;
  Vector<int,_2> local_2e0;
  value_type local_2d8;
  ulong local_2b8;
  Vector<int,_2> local_2b0;
  value_type local_2a8;
  deRandom local_288;
  undefined8 local_278;
  float local_268;
  undefined4 uStack_264;
  float local_258;
  undefined4 uStack_254;
  float local_248;
  undefined4 uStack_244;
  string local_238;
  undefined1 local_218 [8];
  undefined8 uStack_210;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_208;
  undefined8 local_1f8;
  undefined8 uStack_1f0;
  undefined8 local_1e8;
  undefined8 uStack_1e0;
  bool local_1d8;
  ios_base local_1a0 [24];
  vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_> local_188;
  undefined1 local_168 [208];
  string local_98;
  UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_> local_78;
  float local_68;
  undefined4 uStack_64;
  float local_58;
  undefined4 uStack_54;
  float local_48;
  undefined4 uStack_44;
  undefined1 auVar38 [16];
  undefined1 auVar40 [16];
  undefined1 auVar42 [16];
  
  pRVar17 = Context::getRenderTarget((this->super_TestCase).m_context);
  iVar3 = pRVar17->m_numSamples;
  iVar10 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar33 = CONCAT44(extraout_var,iVar10);
  deRandom_init(&local_288,0xabc123);
  local_218 = (undefined1  [8])
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&uStack_210);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&uStack_210,"Using BlitFramebuffer to blit area from ",0x28);
  bVar36 = this->m_src == TARGET_DEFAULT;
  pcVar27 = "fbo";
  pcVar29 = "fbo";
  if (bVar36) {
    pcVar29 = "default fb";
  }
  lVar25 = 3;
  if (bVar36) {
    lVar25 = 10;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&uStack_210,pcVar29,lVar25);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&uStack_210," to ",4);
  bVar36 = this->m_dst == TARGET_DEFAULT;
  if (bVar36) {
    pcVar27 = "default fb";
  }
  lVar25 = 3;
  if (bVar36) {
    lVar25 = 10;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&uStack_210,pcVar27,lVar25);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&uStack_210,".\n",2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&uStack_210,
             "Varying blit arguments and primitive bounding box between iterations.\n",0x46);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&uStack_210,"Expecting bounding box to have no effect on blitting.\n",0x36);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&uStack_210,"Source framebuffer is filled with green-yellow grid.\n",0x35);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_218,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&uStack_210);
  std::ios_base::~ios_base(local_1a0);
  ctxType.super_ApiType.m_bits =
       (ApiType)(*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[2])();
  bVar36 = glu::contextSupports(ctxType,(ApiType)0x23);
  if ((!bVar36) &&
     (bVar36 = glu::ContextInfo::isExtensionSupported
                         (((this->super_TestCase).m_context)->m_contextInfo,
                          "GL_EXT_primitive_bounding_box"), !bVar36)) {
    pNVar24 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    local_218 = (undefined1  [8])&local_208;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_218,"Test requires GL_EXT_primitive_bounding_box extension","");
    tcu::NotSupportedError::NotSupportedError(pNVar24,(string *)local_218);
    __cxa_throw(pNVar24,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
  pcVar27 = (char *)CONCAT71((int7)((ulong)in_RCX >> 8),iVar3 < 2);
  RVar12 = this->m_dst;
  if (RVar12 == TARGET_DEFAULT && iVar3 >= 2) {
    pNVar24 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    local_218 = (undefined1  [8])&local_208;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_218,"Test requires non-multisampled default framebuffer","");
    tcu::NotSupportedError::NotSupportedError(pNVar24,(string *)local_218);
    __cxa_throw(pNVar24,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
  if (this->m_src == TARGET_FBO) {
    pOVar18 = (ObjectWrapper *)operator_new(0x18);
    iVar10 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
    pOVar19 = glu::objectTraits(OBJECTTYPE_RENDERBUFFER);
    glu::ObjectWrapper::ObjectWrapper(pOVar18,(Functions *)CONCAT44(extraout_var_00,iVar10),pOVar19)
    ;
    local_218 = (undefined1  [8])0x0;
    pMVar1 = &this->m_srcRbo;
    if (&((this->m_srcRbo).
          super_UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)2>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)2>_>_>
          .m_data.ptr)->super_ObjectWrapper != pOVar18) {
      de::details::
      UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)2>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)2>_>_>
      ::reset(&pMVar1->
               super_UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)2>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)2>_>_>
             );
      (pMVar1->
      super_UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)2>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)2>_>_>
      ).m_data.ptr = (TypedObjectWrapper<(glu::ObjectType)2> *)pOVar18;
    }
    de::details::
    UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)2>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)2>_>_>
    ::reset((UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)2>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)2>_>_>
             *)local_218);
    (**(code **)(lVar33 + 0xa0))
              (0x8d41,(((pMVar1->
                        super_UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)2>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)2>_>_>
                        ).m_data.ptr)->super_ObjectWrapper).m_object);
    (**(code **)(lVar33 + 0x1238))(0x8d41,0x8058,0x100,0x100);
    dVar11 = (**(code **)(lVar33 + 0x800))();
    glu::checkError(dVar11,"src rbo",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fPrimitiveBoundingBoxTests.cpp"
                    ,0xd39);
    pOVar18 = (ObjectWrapper *)operator_new(0x18);
    iVar10 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
    pOVar19 = glu::objectTraits(OBJECTTYPE_FRAMEBUFFER);
    glu::ObjectWrapper::ObjectWrapper(pOVar18,(Functions *)CONCAT44(extraout_var_01,iVar10),pOVar19)
    ;
    local_218 = (undefined1  [8])0x0;
    if (&((this->m_srcFbo).
          super_UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)3>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)3>_>_>
          .m_data.ptr)->super_ObjectWrapper != pOVar18) {
      de::details::
      UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)3>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)3>_>_>
      ::reset(&(this->m_srcFbo).
               super_UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)3>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)3>_>_>
             );
      (this->m_srcFbo).
      super_UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)3>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)3>_>_>
      .m_data.ptr = (TypedObjectWrapper<(glu::ObjectType)3> *)pOVar18;
    }
    de::details::
    UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)3>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)3>_>_>
    ::reset((UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)3>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)3>_>_>
             *)local_218);
    (**(code **)(lVar33 + 0x78))
              (0x8d40,(((this->m_srcFbo).
                        super_UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)3>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)3>_>_>
                        .m_data.ptr)->super_ObjectWrapper).m_object);
    (**(code **)(lVar33 + 0x688))
              (0x8d40,0x8ce0,0x8d41,
               (((this->m_srcRbo).
                 super_UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)2>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)2>_>_>
                 .m_data.ptr)->super_ObjectWrapper).m_object);
    dVar11 = (**(code **)(lVar33 + 0x800))();
    pcVar27 = (char *)0xd3e;
    glu::checkError(dVar11,"src fbo",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fPrimitiveBoundingBoxTests.cpp"
                    ,0xd3e);
    RVar12 = this->m_dst;
  }
  if (RVar12 == TARGET_FBO) {
    pOVar18 = (ObjectWrapper *)operator_new(0x18);
    iVar10 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
    pOVar19 = glu::objectTraits(OBJECTTYPE_RENDERBUFFER);
    glu::ObjectWrapper::ObjectWrapper(pOVar18,(Functions *)CONCAT44(extraout_var_02,iVar10),pOVar19)
    ;
    local_218 = (undefined1  [8])0x0;
    pMVar1 = &this->m_dstRbo;
    if (&((this->m_dstRbo).
          super_UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)2>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)2>_>_>
          .m_data.ptr)->super_ObjectWrapper != pOVar18) {
      de::details::
      UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)2>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)2>_>_>
      ::reset(&pMVar1->
               super_UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)2>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)2>_>_>
             );
      (pMVar1->
      super_UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)2>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)2>_>_>
      ).m_data.ptr = (TypedObjectWrapper<(glu::ObjectType)2> *)pOVar18;
    }
    de::details::
    UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)2>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)2>_>_>
    ::reset((UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)2>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)2>_>_>
             *)local_218);
    (**(code **)(lVar33 + 0xa0))
              (0x8d41,(((pMVar1->
                        super_UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)2>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)2>_>_>
                        ).m_data.ptr)->super_ObjectWrapper).m_object);
    (**(code **)(lVar33 + 0x1238))(0x8d41,0x8058,0x100,0x100);
    dVar11 = (**(code **)(lVar33 + 0x800))();
    glu::checkError(dVar11,"dst rbo",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fPrimitiveBoundingBoxTests.cpp"
                    ,0xd46);
    pOVar18 = (ObjectWrapper *)operator_new(0x18);
    iVar10 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
    pOVar19 = glu::objectTraits(OBJECTTYPE_FRAMEBUFFER);
    glu::ObjectWrapper::ObjectWrapper(pOVar18,(Functions *)CONCAT44(extraout_var_03,iVar10),pOVar19)
    ;
    local_218 = (undefined1  [8])0x0;
    this_00 = &this->m_dstFbo;
    if (&((this->m_dstFbo).
          super_UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)3>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)3>_>_>
          .m_data.ptr)->super_ObjectWrapper != pOVar18) {
      de::details::
      UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)3>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)3>_>_>
      ::reset(&this_00->
               super_UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)3>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)3>_>_>
             );
      (this_00->
      super_UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)3>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)3>_>_>
      ).m_data.ptr = (TypedObjectWrapper<(glu::ObjectType)3> *)pOVar18;
    }
    de::details::
    UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)3>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)3>_>_>
    ::reset((UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)3>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)3>_>_>
             *)local_218);
    (**(code **)(lVar33 + 0x78))
              (0x8d40,(((this_00->
                        super_UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)3>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)3>_>_>
                        ).m_data.ptr)->super_ObjectWrapper).m_object);
    (**(code **)(lVar33 + 0x688))
              (0x8d40,0x8ce0,0x8d41,
               (((pMVar1->
                 super_UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)2>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)2>_>_>
                 ).m_data.ptr)->super_ObjectWrapper).m_object);
    dVar11 = (**(code **)(lVar33 + 0x800))();
    pcVar27 = (char *)0xd4b;
    glu::checkError(dVar11,"dst fbo",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fPrimitiveBoundingBoxTests.cpp"
                    ,0xd4b);
  }
  pSVar20 = (ShaderProgram *)operator_new(0xd0);
  this_02 = (this->super_TestCase).m_context;
  renderCtx = this_02->m_renderCtx;
  memset(local_218,0,0xac);
  local_168._0_8_ = (pointer)0x0;
  local_168[8] = 0;
  local_168._9_7_ = 0;
  local_168[0x10] = 0;
  local_168._17_8_ = 0;
  Functional::(anonymous_namespace)::specializeShader_abi_cxx11_
            (&local_238,(_anonymous_namespace_ *)this_02,
             (Context *)
             "${GLSL_VERSION_DECL}\nin highp vec4 a_position;\nout highp vec4 v_position;\nvoid main()\n{\n\tgl_Position = a_position;\n\tv_position = a_position;\n}\n"
             ,pcVar27);
  local_2b0.m_data[0] = 0;
  local_2a8._M_dataplus._M_p = (pointer)&local_2a8.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_2a8,local_238._M_dataplus._M_p,
             local_238._M_dataplus._M_p + local_238._M_string_length);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_218 + (ulong)(uint)local_2b0.m_data[0] * 0x18),&local_2a8);
  Functional::(anonymous_namespace)::specializeShader_abi_cxx11_
            (&local_98,(_anonymous_namespace_ *)(this->super_TestCase).m_context,
             (Context *)
             "${GLSL_VERSION_DECL}\nin mediump vec4 v_position;\nlayout(location=0) out mediump vec4 dEQP_FragColor;\nvoid main()\n{\n\tconst mediump vec4 green = vec4(0.0, 1.0, 0.0, 1.0);\n\tconst mediump vec4 yellow = vec4(1.0, 1.0, 0.0, 1.0);\n\tdEQP_FragColor = (step(0.1, mod(v_position.x, 0.2)) == step(0.1, mod(v_position.y, 0.2))) ? (green) : (yellow);\n}\n"
             ,pcVar27);
  local_2e0.m_data[0] = 1;
  local_2d8._M_dataplus._M_p = (pointer)&local_2d8.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_2d8,local_98._M_dataplus._M_p,
             local_98._M_dataplus._M_p + local_98._M_string_length);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_218 + (ulong)(uint)local_2e0.m_data[0] * 0x18),&local_2d8);
  glu::ShaderProgram::ShaderProgram(pSVar20,renderCtx,(ProgramSources *)local_218);
  local_78.m_data.ptr = (ShaderProgram *)0x0;
  this_01 = &this->m_program;
  if ((this->m_program).
      super_UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>.m_data.ptr !=
      pSVar20) {
    de::details::UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>::reset
              (&this_01->
                super_UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>);
    (this_01->super_UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>).m_data.
    ptr = pSVar20;
  }
  de::details::UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>::reset
            (&local_78);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
    operator_delete(local_2d8._M_dataplus._M_p,local_2d8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
    operator_delete(local_2a8._M_dataplus._M_p,local_2a8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._M_dataplus._M_p != &local_238.field_2) {
    operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_168);
  std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
            (&local_188);
  lVar25 = 0x78;
  do {
    ctx_00 = (EVP_PKEY_CTX *)(local_218 + lVar25);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)ctx_00);
    lVar25 = lVar25 + -0x18;
  } while (lVar25 != -0x18);
  pSVar20 = (this_01->super_UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>)
            .m_data.ptr;
  if ((pSVar20->m_program).m_info.linkOk != false) {
    if (Functional::(anonymous_namespace)::BlitFboCase::init()::s_quadCoords == '\0') {
      _GLOBAL__N_1::BlitFboCase::init(ctx_00);
    }
    pOVar18 = (ObjectWrapper *)operator_new(0x18);
    iVar10 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
    pOVar19 = glu::objectTraits(OBJECTTYPE_BUFFER);
    glu::ObjectWrapper::ObjectWrapper(pOVar18,(Functions *)CONCAT44(extraout_var_04,iVar10),pOVar19)
    ;
    local_218 = (undefined1  [8])0x0;
    if (&((this->m_vbo).
          super_UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)1>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)1>_>_>
          .m_data.ptr)->super_ObjectWrapper != pOVar18) {
      de::details::
      UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)1>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)1>_>_>
      ::reset(&(this->m_vbo).
               super_UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)1>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)1>_>_>
             );
      (this->m_vbo).
      super_UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)1>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)1>_>_>
      .m_data.ptr = (TypedObjectWrapper<(glu::ObjectType)1> *)pOVar18;
    }
    de::details::
    UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)1>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)1>_>_>
    ::reset((UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)1>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)1>_>_>
             *)local_218);
    (**(code **)(lVar33 + 0x40))
              (0x8892,(((this->m_vbo).
                        super_UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)1>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)1>_>_>
                        .m_data.ptr)->super_ObjectWrapper).m_object);
    (**(code **)(lVar33 + 0x150))(0x8892,0x40,init::s_quadCoords,0x88e4);
    dVar11 = (**(code **)(lVar33 + 0x800))();
    glu::checkError(dVar11,"set buf",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fPrimitiveBoundingBoxTests.cpp"
                    ,0xd77);
    fVar26 = 3.58732e-43;
    fVar37 = 3.58732e-43;
    local_2b0.m_data[1] = 0x100;
    if (this->m_src == TARGET_DEFAULT) {
      pRVar17 = Context::getRenderTarget((this->super_TestCase).m_context);
      fVar37 = (float)pRVar17->m_width;
      pRVar17 = Context::getRenderTarget((this->super_TestCase).m_context);
      local_2b0.m_data[1] = pRVar17->m_height;
    }
    local_2e0.m_data[1] = 0x100;
    local_2b0.m_data[0] = (int)fVar37;
    if (this->m_dst == TARGET_DEFAULT) {
      pRVar17 = Context::getRenderTarget((this->super_TestCase).m_context);
      fVar26 = (float)pRVar17->m_width;
      pRVar17 = Context::getRenderTarget((this->super_TestCase).m_context);
      local_2e0.m_data[1] = pRVar17->m_height;
    }
    local_218 = (undefined1  [8])
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    local_2e0.m_data[0] = (int)fVar26;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&uStack_210);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&uStack_210,"srcSize = ",10);
    tcu::operator<<((ostream *)&uStack_210,&local_2b0);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&uStack_210,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&uStack_210,"dstSize = ",10);
    tcu::operator<<((ostream *)&uStack_210,&local_2e0);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&uStack_210,"\n",1);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_218,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&uStack_210);
    std::ios_base::~ios_base(local_1a0);
    local_2b8 = 0;
    do {
      iVar10 = local_2b0.m_data[0];
      local_1e8 = (pointer)0x0;
      uStack_1e0 = (pointer)0x0;
      local_1f8 = (pointer)0x0;
      uStack_1f0 = (pointer)0x0;
      local_208._M_allocated_capacity = 0;
      local_208._8_8_ = (pointer)0x0;
      local_218 = (undefined1  [8])0x0;
      uStack_210 = (pointer)0x0;
      if ((iVar3 < 2) || (this->m_src != TARGET_DEFAULT)) {
        dVar11 = deRandom_getUint32(&local_288);
        iVar9 = local_2b0.m_data[1];
        dVar13 = deRandom_getUint32(&local_288);
        iVar8 = local_2b0.m_data[0];
        dVar14 = deRandom_getUint32(&local_288);
        iVar31 = local_2b0.m_data[1];
        dVar15 = deRandom_getUint32(&local_288);
        iVar30 = local_2e0.m_data[0];
        local_248 = (float)(dVar15 % (iVar31 - dVar13 % (uint)iVar9));
        dVar15 = deRandom_getUint32(&local_288);
        iVar31 = local_2e0.m_data[1];
        uVar32 = dVar15 % (uint)iVar30;
        local_258 = (float)(dVar14 % (iVar8 - dVar11 % (uint)iVar10));
        dVar14 = deRandom_getUint32(&local_288);
        uVar7 = dVar14 % (uint)iVar31;
        local_268 = (float)local_2e0.m_data[0];
        uStack_264 = 0;
        dVar14 = deRandom_getUint32(&local_288);
        local_278 = (ulong)(uint)local_2e0.m_data[1];
        dVar15 = deRandom_getUint32(&local_288);
        iVar30 = (int)(uVar7 + 1) / 2;
        iVar31 = (int)(uVar32 + 1) / 2;
        local_208._M_allocated_capacity._0_4_ =
             dVar14 % ((int)local_268 +
                       (iVar31 - ((int)((uVar32 - ((int)(uVar32 + 2) >> 0x1f)) + 2) >> 1)) + 1U) -
             iVar31;
        local_208._M_allocated_capacity._4_4_ =
             dVar15 % ((int)local_278 +
                       (iVar30 - ((int)((uVar7 - ((int)(uVar7 + 2) >> 0x1f)) + 2) >> 1)) + 1U) -
             iVar30;
        local_218._4_4_ = local_248;
        local_218._0_4_ = local_258;
        uStack_210 = (pointer)CONCAT44(dVar13 % (uint)iVar9 + 1 + (int)local_248,
                                       dVar11 % (uint)iVar10 + 1 + (int)local_258);
        local_208._12_4_ = local_208._M_allocated_capacity._4_4_ + uVar7 + 1;
        local_208._8_4_ = local_208._M_allocated_capacity._0_4_ + uVar32 + 1;
      }
      else {
        fVar37 = (float)local_2e0.m_data[0];
        if (local_2b0.m_data[0] < local_2e0.m_data[0]) {
          fVar37 = (float)local_2b0.m_data[0];
        }
        uVar32 = local_2e0.m_data[1];
        if (local_2b0.m_data[1] < local_2e0.m_data[1]) {
          uVar32 = local_2b0.m_data[1];
        }
        dVar11 = deRandom_getUint32(&local_288);
        dVar13 = deRandom_getUint32(&local_288);
        dVar14 = deRandom_getUint32(&local_288);
        dVar15 = deRandom_getUint32(&local_288);
        local_218._0_4_ = dVar14 % ((int)fVar37 - dVar11 % (uint)fVar37);
        local_218._4_4_ = dVar15 % (uVar32 - dVar13 % uVar32);
        local_208._8_4_ = dVar11 % (uint)fVar37 + 1 + local_218._0_4_;
        local_208._12_4_ = dVar13 % uVar32 + 1 + local_218._4_4_;
        uStack_210 = (pointer)CONCAT44(local_208._12_4_,local_208._8_4_);
        local_208._M_allocated_capacity._4_4_ = local_218._4_4_;
        local_208._M_allocated_capacity._0_4_ = local_218._0_4_;
      }
      fVar37 = deRandom_getFloat(&local_288);
      local_248 = fVar37 * 2.2 + -1.1;
      local_1f8 = (pointer)CONCAT44(local_1f8._4_4_,local_248);
      uStack_244 = extraout_XMM0_Db;
      fVar37 = deRandom_getFloat(&local_288);
      local_258 = fVar37 * 2.2 + -1.1;
      uStack_254 = extraout_XMM0_Db_00;
      local_1f8._4_4_ = local_258;
      fVar37 = deRandom_getFloat(&local_288);
      local_268 = fVar37 * 2.2 + -1.1;
      uStack_1f0 = (pointer)CONCAT44(uStack_1f0._4_4_,local_268);
      uStack_264 = extraout_XMM0_Db_01;
      fVar37 = deRandom_getFloat(&local_288);
      fVar37 = fVar37 * 0.20000005 + 0.9;
      local_278 = CONCAT44(extraout_XMM0_Db_02,fVar37);
      uStack_1f0._4_4_ = fVar37;
      fVar37 = deRandom_getFloat(&local_288);
      local_48 = fVar37 * 2.2 + -1.1;
      local_1e8 = (pointer)CONCAT44(local_1e8._4_4_,local_48);
      uStack_44 = extraout_XMM0_Db_03;
      fVar37 = deRandom_getFloat(&local_288);
      local_58 = fVar37 * 2.2 + -1.1;
      uStack_54 = extraout_XMM0_Db_04;
      local_1e8._4_4_ = local_58;
      fVar37 = deRandom_getFloat(&local_288);
      local_68 = fVar37 * 2.2 + -1.1;
      uStack_1e0 = (pointer)CONCAT44(uStack_1e0._4_4_,local_68);
      uStack_64 = extraout_XMM0_Db_05;
      fVar37 = deRandom_getFloat(&local_288);
      fVar37 = fVar37 * 0.20000005 + 0.9;
      auVar43._4_4_ = uStack_244;
      auVar43._0_4_ = local_248;
      auVar43._8_4_ = uStack_244;
      auVar43._12_4_ = uStack_44;
      auVar42._8_8_ = auVar43._8_8_;
      auVar42._4_4_ = local_48;
      auVar42._0_4_ = local_248;
      auVar44._4_4_ = fVar37;
      auVar44._0_4_ = (undefined4)local_278;
      auVar44._8_4_ = local_278._4_4_;
      auVar44._12_4_ = extraout_XMM0_Db_06;
      auVar44 = divps(auVar42,auVar44);
      if (auVar44._4_4_ < auVar44._0_4_) {
        local_1f8._0_4_ = local_48;
        local_1e8._0_4_ = local_248;
      }
      auVar39._4_4_ = uStack_254;
      auVar39._0_4_ = local_258;
      auVar39._8_4_ = uStack_254;
      auVar39._12_4_ = uStack_54;
      auVar38._8_8_ = auVar39._8_8_;
      auVar38._4_4_ = local_58;
      auVar38._0_4_ = local_258;
      auVar5._4_4_ = fVar37;
      auVar5._0_4_ = (undefined4)local_278;
      auVar5._8_4_ = local_278._4_4_;
      auVar5._12_4_ = extraout_XMM0_Db_06;
      auVar44 = divps(auVar38,auVar5);
      if (auVar44._4_4_ < auVar44._0_4_) {
        local_1f8._4_4_ = local_58;
        local_1e8._4_4_ = local_258;
      }
      auVar41._4_4_ = uStack_264;
      auVar41._0_4_ = local_268;
      auVar41._8_4_ = uStack_264;
      auVar41._12_4_ = uStack_64;
      auVar40._8_8_ = auVar41._8_8_;
      auVar40._4_4_ = local_68;
      auVar40._0_4_ = local_268;
      auVar6._4_4_ = fVar37;
      auVar6._0_4_ = (undefined4)local_278;
      auVar6._8_4_ = local_278._4_4_;
      auVar6._12_4_ = extraout_XMM0_Db_06;
      auVar44 = divps(auVar40,auVar6);
      if (auVar44._4_4_ < auVar44._0_4_) {
        uStack_1f0._0_4_ = local_68;
        uStack_1e0._0_4_ = local_268;
      }
      uStack_1e0 = (pointer)CONCAT44(fVar37,(float)uStack_1e0);
      dVar16 = deRandom_getBool(&local_288);
      local_1d8 = dVar16 == 1;
      __a = (this->m_iterations).
            super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::BlitFboCase::BlitArgs,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::BlitFboCase::BlitArgs>_>
            ._M_impl.super__Vector_impl_data._M_finish;
      if (__a == (this->m_iterations).
                 super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::BlitFboCase::BlitArgs,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::BlitFboCase::BlitArgs>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        pBVar4 = (this->m_iterations).
                 super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::BlitFboCase::BlitArgs,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::BlitFboCase::BlitArgs>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        if ((long)__a - (long)pBVar4 == 0x7fffffffffffffc4) {
          std::__throw_length_error("vector::_M_realloc_insert");
        }
        lVar33 = (long)__a - (long)pBVar4 >> 2;
        uVar34 = lVar33 * -0xf0f0f0f0f0f0f0f;
        uVar21 = uVar34;
        if (__a == pBVar4) {
          uVar21 = 1;
        }
        uVar28 = uVar21 + uVar34;
        if (0x1e1e1e1e1e1e1e0 < uVar28) {
          uVar28 = 0x1e1e1e1e1e1e1e1;
        }
        if (CARRY8(uVar21,uVar34)) {
          uVar28 = 0x1e1e1e1e1e1e1e1;
        }
        if (uVar28 == 0) {
          pBVar22 = (pointer)0x0;
          __args_00 = __args;
        }
        else {
          pBVar22 = (pointer)operator_new(uVar28 * 0x44);
          __args_00 = extraout_RDX;
        }
        std::
        allocator_traits<std::allocator<deqp::gles31::Functional::(anonymous_namespace)::BlitFboCase::BlitArgs>>
        ::
        construct<deqp::gles31::Functional::(anonymous_namespace)::BlitFboCase::BlitArgs,deqp::gles31::Functional::(anonymous_namespace)::BlitFboCase::BlitArgs_const&>
                  ((allocator_type *)((pBVar22->src).m_data + lVar33),(BlitArgs *)local_218,
                   __args_00);
        pBVar35 = pBVar22;
        for (pBVar23 = pBVar4; __a != pBVar23; pBVar23 = pBVar23 + 1) {
          lVar33 = 0;
          do {
            (pBVar35->src).m_data[lVar33] = (pBVar23->src).m_data[lVar33];
            lVar33 = lVar33 + 1;
          } while (lVar33 != 4);
          lVar33 = 4;
          do {
            (pBVar35->src).m_data[lVar33] = (pBVar23->src).m_data[lVar33];
            lVar33 = lVar33 + 1;
          } while (lVar33 != 8);
          lVar33 = 8;
          do {
            (pBVar35->src).m_data[lVar33] = (pBVar23->src).m_data[lVar33];
            lVar33 = lVar33 + 1;
          } while (lVar33 != 0xc);
          lVar33 = 0xc;
          do {
            (pBVar35->src).m_data[lVar33] = (pBVar23->src).m_data[lVar33];
            lVar33 = lVar33 + 1;
          } while (lVar33 != 0x10);
          pBVar35->linear = pBVar23->linear;
          pBVar35 = pBVar35 + 1;
        }
        if (pBVar4 != (pointer)0x0) {
          operator_delete(pBVar4,(long)(this->m_iterations).
                                       super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::BlitFboCase::BlitArgs,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::BlitFboCase::BlitArgs>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                 (long)pBVar4);
        }
        (this->m_iterations).
        super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::BlitFboCase::BlitArgs,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::BlitFboCase::BlitArgs>_>
        ._M_impl.super__Vector_impl_data._M_start = pBVar22;
        (this->m_iterations).
        super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::BlitFboCase::BlitArgs,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::BlitFboCase::BlitArgs>_>
        ._M_impl.super__Vector_impl_data._M_finish = pBVar35 + 1;
        pBVar22 = pBVar22 + uVar28;
        (this->m_iterations).
        super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::BlitFboCase::BlitArgs,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::BlitFboCase::BlitArgs>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = pBVar22;
      }
      else {
        std::
        allocator_traits<std::allocator<deqp::gles31::Functional::(anonymous_namespace)::BlitFboCase::BlitArgs>>
        ::
        construct<deqp::gles31::Functional::(anonymous_namespace)::BlitFboCase::BlitArgs,deqp::gles31::Functional::(anonymous_namespace)::BlitFboCase::BlitArgs_const&>
                  ((allocator_type *)__a,(BlitArgs *)local_218,__args);
        ppBVar2 = &(this->m_iterations).
                   super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::BlitFboCase::BlitArgs,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::BlitFboCase::BlitArgs>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        *ppBVar2 = *ppBVar2 + 1;
        pBVar22 = extraout_RAX;
      }
      uVar32 = (int)local_2b8 + 1;
      local_2b8 = (ulong)uVar32;
    } while (uVar32 != 0xc);
    return (int)pBVar22;
  }
  glu::operator<<(((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log,pSVar20);
  this_03 = (TestError *)__cxa_allocate_exception(0x38);
  local_218 = (undefined1  [8])&local_208;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_218,"failed to build program","");
  tcu::TestError::TestError(this_03,(string *)local_218);
  __cxa_throw(this_03,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void BlitFboCase::init (void)
{
	const int				numIterations			= 12;
	const bool				defaultFBMultisampled	= (m_context.getRenderTarget().getNumSamples() > 1);
	const glw::Functions&	gl						= m_context.getRenderContext().getFunctions();
	de::Random				rnd						(0xABC123);

	m_testCtx.getLog()
		<< tcu::TestLog::Message
		<< "Using BlitFramebuffer to blit area from "
			<< ((m_src == TARGET_DEFAULT) ? ("default fb") : ("fbo"))
			<< " to "
			<< ((m_dst == TARGET_DEFAULT) ? ("default fb") : ("fbo"))
			<< ".\n"
		<< "Varying blit arguments and primitive bounding box between iterations.\n"
		<< "Expecting bounding box to have no effect on blitting.\n"
		<< "Source framebuffer is filled with green-yellow grid.\n"
		<< tcu::TestLog::EndMessage;

	const bool supportsES32 = glu::contextSupports(m_context.getRenderContext().getType(), glu::ApiType::es(3, 2));

	if (!supportsES32 && !m_context.getContextInfo().isExtensionSupported("GL_EXT_primitive_bounding_box"))
		throw tcu::NotSupportedError("Test requires GL_EXT_primitive_bounding_box extension");
	if (m_dst == TARGET_DEFAULT && defaultFBMultisampled)
		throw tcu::NotSupportedError("Test requires non-multisampled default framebuffer");

	// resources

	if (m_src == TARGET_FBO)
	{
		m_srcRbo = de::MovePtr<glu::Renderbuffer>(new glu::Renderbuffer(m_context.getRenderContext()));
		gl.bindRenderbuffer(GL_RENDERBUFFER, **m_srcRbo);
		gl.renderbufferStorage(GL_RENDERBUFFER, GL_RGBA8, FBO_SIZE, FBO_SIZE);
		GLU_EXPECT_NO_ERROR(gl.getError(), "src rbo");

		m_srcFbo = de::MovePtr<glu::Framebuffer>(new glu::Framebuffer(m_context.getRenderContext()));
		gl.bindFramebuffer(GL_FRAMEBUFFER, **m_srcFbo);
		gl.framebufferRenderbuffer(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_RENDERBUFFER, **m_srcRbo);
		GLU_EXPECT_NO_ERROR(gl.getError(), "src fbo");
	}

	if (m_dst == TARGET_FBO)
	{
		m_dstRbo = de::MovePtr<glu::Renderbuffer>(new glu::Renderbuffer(m_context.getRenderContext()));
		gl.bindRenderbuffer(GL_RENDERBUFFER, **m_dstRbo);
		gl.renderbufferStorage(GL_RENDERBUFFER, GL_RGBA8, FBO_SIZE, FBO_SIZE);
		GLU_EXPECT_NO_ERROR(gl.getError(), "dst rbo");

		m_dstFbo = de::MovePtr<glu::Framebuffer>(new glu::Framebuffer(m_context.getRenderContext()));
		gl.bindFramebuffer(GL_FRAMEBUFFER, **m_dstFbo);
		gl.framebufferRenderbuffer(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_RENDERBUFFER, **m_dstRbo);
		GLU_EXPECT_NO_ERROR(gl.getError(), "dst fbo");
	}

	{
		const char* const vertexSource =	"${GLSL_VERSION_DECL}\n"
													"in highp vec4 a_position;\n"
													"out highp vec4 v_position;\n"
													"void main()\n"
													"{\n"
													"	gl_Position = a_position;\n"
													"	v_position = a_position;\n"
													"}\n";
		const char* const fragmentSource =	"${GLSL_VERSION_DECL}\n"
													"in mediump vec4 v_position;\n"
													"layout(location=0) out mediump vec4 dEQP_FragColor;\n"
													"void main()\n"
													"{\n"
													"	const mediump vec4 green = vec4(0.0, 1.0, 0.0, 1.0);\n"
													"	const mediump vec4 yellow = vec4(1.0, 1.0, 0.0, 1.0);\n"
													"	dEQP_FragColor = (step(0.1, mod(v_position.x, 0.2)) == step(0.1, mod(v_position.y, 0.2))) ? (green) : (yellow);\n"
													"}\n";

		m_program = de::MovePtr<glu::ShaderProgram>(new glu::ShaderProgram(m_context.getRenderContext(), glu::ProgramSources() << glu::VertexSource(specializeShader(m_context, vertexSource)) << glu::FragmentSource(specializeShader(m_context, fragmentSource))));

		if (!m_program->isOk())
		{
			m_testCtx.getLog() << *m_program;
			throw tcu::TestError("failed to build program");
		}
	}

	{
		static const tcu::Vec4 s_quadCoords[] =
		{
			tcu::Vec4(-1.0f, -1.0f, 0.0f, 1.0f),
			tcu::Vec4(-1.0f,  1.0f, 0.0f, 1.0f),
			tcu::Vec4( 1.0f, -1.0f, 0.0f, 1.0f),
			tcu::Vec4( 1.0f,  1.0f, 0.0f, 1.0f),
		};

		m_vbo = de::MovePtr<glu::Buffer>(new glu::Buffer(m_context.getRenderContext()));

		gl.bindBuffer(GL_ARRAY_BUFFER, **m_vbo);
		gl.bufferData(GL_ARRAY_BUFFER, sizeof(s_quadCoords), s_quadCoords, GL_STATIC_DRAW);
		GLU_EXPECT_NO_ERROR(gl.getError(), "set buf");
	}

	// gen iterations

	{
		const tcu::IVec2 srcSize = (m_src == TARGET_DEFAULT) ? (tcu::IVec2(m_context.getRenderTarget().getWidth(), m_context.getRenderTarget().getHeight())) : (tcu::IVec2(FBO_SIZE, FBO_SIZE));
		const tcu::IVec2 dstSize = (m_dst == TARGET_DEFAULT) ? (tcu::IVec2(m_context.getRenderTarget().getWidth(), m_context.getRenderTarget().getHeight())) : (tcu::IVec2(FBO_SIZE, FBO_SIZE));

		m_testCtx.getLog()
			<< tcu::TestLog::Message
			<< "srcSize = " << srcSize << "\n"
			<< "dstSize = " << dstSize << "\n"
			<< tcu::TestLog::EndMessage;

		for (int ndx = 0; ndx < numIterations; ++ndx)
		{
			BlitArgs args;

			if (m_src == TARGET_DEFAULT && defaultFBMultisampled)
			{
				const tcu::IVec2	unionSize	= tcu::IVec2(de::min(srcSize.x(), dstSize.x()), de::min(srcSize.y(), dstSize.y()));
				const int			srcWidth	= rnd.getInt(1, unionSize.x());
				const int			srcHeight	= rnd.getInt(1, unionSize.y());
				const int			srcX		= rnd.getInt(0, unionSize.x() - srcWidth);
				const int			srcY		= rnd.getInt(0, unionSize.y() - srcHeight);

				args.src.x() = srcX;
				args.src.y() = srcY;
				args.src.z() = srcX + srcWidth;
				args.src.w() = srcY + srcHeight;

				args.dst = args.src;
			}
			else
			{
				const int	srcWidth	= rnd.getInt(1, srcSize.x());
				const int	srcHeight	= rnd.getInt(1, srcSize.y());
				const int	srcX		= rnd.getInt(0, srcSize.x() - srcWidth);
				const int	srcY		= rnd.getInt(0, srcSize.y() - srcHeight);
				const int	dstWidth	= rnd.getInt(1, dstSize.x());
				const int	dstHeight	= rnd.getInt(1, dstSize.y());
				const int	dstX		= rnd.getInt(-(dstWidth / 2), dstSize.x() - (dstWidth+1) / 2);		// allow dst go out of bounds
				const int	dstY		= rnd.getInt(-(dstHeight / 2), dstSize.y() - (dstHeight+1)  / 2);

				args.src.x() = srcX;
				args.src.y() = srcY;
				args.src.z() = srcX + srcWidth;
				args.src.w() = srcY + srcHeight;
				args.dst.x() = dstX;
				args.dst.y() = dstY;
				args.dst.z() = dstX + dstWidth;
				args.dst.w() = dstY + dstHeight;
			}

			args.bboxMin.x() = rnd.getFloat(-1.1f, 1.1f);
			args.bboxMin.y() = rnd.getFloat(-1.1f, 1.1f);
			args.bboxMin.z() = rnd.getFloat(-1.1f, 1.1f);
			args.bboxMin.w() = rnd.getFloat( 0.9f, 1.1f);

			args.bboxMax.x() = rnd.getFloat(-1.1f, 1.1f);
			args.bboxMax.y() = rnd.getFloat(-1.1f, 1.1f);
			args.bboxMax.z() = rnd.getFloat(-1.1f, 1.1f);
			args.bboxMax.w() = rnd.getFloat( 0.9f, 1.1f);

			if (args.bboxMin.x() / args.bboxMin.w() > args.bboxMax.x() / args.bboxMax.w())
				std::swap(args.bboxMin.x(), args.bboxMax.x());
			if (args.bboxMin.y() / args.bboxMin.w() > args.bboxMax.y() / args.bboxMax.w())
				std::swap(args.bboxMin.y(), args.bboxMax.y());
			if (args.bboxMin.z() / args.bboxMin.w() > args.bboxMax.z() / args.bboxMax.w())
				std::swap(args.bboxMin.z(), args.bboxMax.z());

			args.linear = rnd.getBool();

			m_iterations.push_back(args);
		}
	}
}